

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImVector<float> *this;
  ImGuiNextItemData *pIVar1;
  ImGuiContext *pIVar2;
  float *v;
  int i;
  int iVar3;
  float fVar4;
  float fVar5;
  float local_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  pIVar2 = GImGui;
  this = &(GImGui->CurrentWindow->DC).ItemWidthStack;
  v = &(GImGui->CurrentWindow->DC).ItemWidth;
  ImVector<float>::push_back(this,v);
  iVar3 = components + -1;
  fStack_34 = 0.0;
  fStack_30 = 0.0;
  fStack_2c = 0.0;
  fVar4 = w_full - (float)iVar3 * (pIVar2->Style).ItemInnerSpacing.x;
  local_38 = fVar4;
  for (; 0 < iVar3; iVar3 = iVar3 + -1) {
    fVar5 = (float)(int)(((float)iVar3 * fVar4) / (float)components);
    fStack_34 = (float)(int)fStack_34;
    fStack_30 = (float)(int)fStack_30;
    fStack_2c = (float)(int)fStack_2c;
    local_3c = local_38 - fVar5;
    if (local_3c <= 1.0) {
      local_3c = 1.0;
    }
    local_38 = fVar5;
    ImVector<float>::push_back(this,&local_3c);
  }
  if (local_38 <= 1.0) {
    local_38 = 1.0;
  }
  *v = local_38;
  pIVar1 = &pIVar2->NextItemData;
  *(byte *)&pIVar1->Flags = (byte)pIVar1->Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(components > 0);
    const ImGuiStyle& style = g.Style;
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    float w_items = w_full - style.ItemInnerSpacing.x * (components - 1);
    float prev_split = w_items;
    for (int i = components - 1; i > 0; i--)
    {
        float next_split = IM_TRUNC(w_items * i / components);
        window->DC.ItemWidthStack.push_back(ImMax(prev_split - next_split, 1.0f));
        prev_split = next_split;
    }
    window->DC.ItemWidth = ImMax(prev_split, 1.0f);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}